

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

bool __thiscall google::anon_unknown_1::FlagValue::ParseFrom(FlagValue *this,char *value)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  int *piVar5;
  ulonglong uVar6;
  size_t sVar7;
  ulonglong uVar8;
  long lVar9;
  ulong uVar10;
  char *end;
  char *local_40;
  double local_38;
  
  cVar1 = this->type_;
  if (cVar1 == '\x06') {
    pvVar2 = this->value_buffer_;
    pcVar3 = *(char **)((long)pvVar2 + 8);
    strlen(value);
    std::__cxx11::string::_M_replace((ulong)pvVar2,0,pcVar3,(ulong)value);
    return true;
  }
  if (cVar1 == '\0') {
    uVar10 = 0xffffffffffffffff;
    lVar9 = 0;
    while( true ) {
      iVar4 = strcasecmp(value,(char *)((long)&DAT_001b277c +
                                       (long)*(int *)((long)&DAT_001b277c + lVar9)));
      if (iVar4 == 0) {
        *(undefined1 *)this->value_buffer_ = 1;
        return true;
      }
      iVar4 = strcasecmp(value,(char *)((long)&DAT_001b2790 +
                                       (long)*(int *)((long)&DAT_001b2790 + lVar9)));
      if (iVar4 == 0) break;
      lVar9 = lVar9 + 4;
      uVar10 = uVar10 + 1;
      if (uVar10 == 4) {
        return uVar10 < 4;
      }
    }
    *(undefined1 *)this->value_buffer_ = 0;
    return true;
  }
  if (*value == '\0') {
    return false;
  }
  iVar4 = 10;
  if (*value == '0') {
    iVar4 = 10;
    if ((value[1] + 0xa8U & 0xdf) == 0) {
      iVar4 = 0x10;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  switch(cVar1) {
  case '\x01':
    uVar6 = strtoll(value,&local_40,iVar4);
    if (*piVar5 != 0) {
      return false;
    }
    sVar7 = strlen(value);
    if (local_40 != value + sVar7) {
      return false;
    }
    uVar8 = uVar6 + 0x80000000;
    break;
  case '\x02':
    for (; *value == ' '; value = value + 1) {
    }
    if (*value == '-') {
      return false;
    }
    uVar8 = strtoull(value,&local_40,iVar4);
    if (*piVar5 != 0) {
      return false;
    }
    sVar7 = strlen(value);
    uVar6 = uVar8;
    if (value + sVar7 != local_40) {
      return false;
    }
    break;
  case '\x03':
    uVar8 = strtoll(value,&local_40,iVar4);
    if (*piVar5 != 0) {
      return false;
    }
    sVar7 = strlen(value);
    if (local_40 != value + sVar7) {
      return false;
    }
    goto LAB_00193d09;
  case '\x04':
    for (; *value == ' '; value = value + 1) {
    }
    if (*value == '-') {
      return false;
    }
    uVar8 = strtoull(value,&local_40,iVar4);
    if (*piVar5 != 0) {
      return false;
    }
    sVar7 = strlen(value);
    if (value + sVar7 != local_40) {
      return false;
    }
LAB_00193d09:
    *(ulonglong *)this->value_buffer_ = uVar8;
    return true;
  case '\x05':
    local_38 = strtod(value,&local_40);
    if (*piVar5 != 0) {
      return false;
    }
    sVar7 = strlen(value);
    if (local_40 != value + sVar7) {
      return false;
    }
    *(double *)this->value_buffer_ = local_38;
    return true;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x158,"bool google::(anonymous namespace)::FlagValue::ParseFrom(const char *)");
  }
  if (uVar8 >> 0x20 == 0) {
    *(int *)this->value_buffer_ = (int)uVar6;
    return true;
  }
  return false;
}

Assistant:

bool FlagValue::ParseFrom(const char* value) {
  if (type_ == FV_BOOL) {
    const char* kTrue[] = { "1", "t", "true", "y", "yes" };
    const char* kFalse[] = { "0", "f", "false", "n", "no" };
    COMPILE_ASSERT(sizeof(kTrue) == sizeof(kFalse), true_false_equal);
    for (size_t i = 0; i < sizeof(kTrue)/sizeof(*kTrue); ++i) {
      if (strcasecmp(value, kTrue[i]) == 0) {
        SET_VALUE_AS(bool, true);
        return true;
      } else if (strcasecmp(value, kFalse[i]) == 0) {
        SET_VALUE_AS(bool, false);
        return true;
      }
    }
    return false;   // didn't match a legal input

  } else if (type_ == FV_STRING) {
    SET_VALUE_AS(string, value);
    return true;
  }

  // OK, it's likely to be numeric, and we'll be using a strtoXXX method.
  if (value[0] == '\0')   // empty-string is only allowed for string type.
    return false;
  char* end;
  // Leading 0x puts us in base 16.  But leading 0 does not put us in base 8!
  // It caused too many bugs when we had that behavior.
  int base = 10;    // by default
  if (value[0] == '0' && (value[1] == 'x' || value[1] == 'X'))
    base = 16;
  errno = 0;

  switch (type_) {
    case FV_INT32: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      if (static_cast<int32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(int32, static_cast<int32>(r));
      return true;
    }
    case FV_UINT32: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
        if (static_cast<uint32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(uint32, static_cast<uint32>(r));
      return true;
    }
    case FV_INT64: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(int64, r);
      return true;
    }
    case FV_UINT64: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(uint64, r);
      return true;
    }
    case FV_DOUBLE: {
      const double r = strtod(value, &end);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(double, r);
      return true;
    }
    default: {
      assert(false);  // unknown type
      return false;
    }
  }
}